

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawUtil.cpp
# Opt level: O3

ConstPixelBufferAccess * __thiscall
vkt::drawutil::ReferenceDrawContext::getColorPixels
          (ConstPixelBufferAccess *__return_storage_ptr__,ReferenceDrawContext *this)

{
  TextureLevel *this_00;
  ConstPixelBufferAccess CStack_f8;
  ConstPixelBufferAccess local_d0;
  ConstPixelBufferAccess local_a8;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  this_00 = &this->m_refImage;
  tcu::TextureLevel::getAccess(&CStack_f8,this_00);
  tcu::TextureLevel::getAccess(&local_58,this_00);
  tcu::TextureLevel::getAccess(&local_80,this_00);
  tcu::TextureLevel::getAccess(&local_a8,this_00);
  tcu::TextureLevel::getAccess(&local_d0,this_00);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,&CStack_f8.m_format,local_58.m_size.m_data[0],
             local_80.m_size.m_data[1],local_a8.m_size.m_data[2],local_d0.m_data);
  return __return_storage_ptr__;
}

Assistant:

tcu::ConstPixelBufferAccess ReferenceDrawContext::getColorPixels (void) const
{
	return tcu::ConstPixelBufferAccess( m_refImage.getAccess().getFormat(),
										m_refImage.getAccess().getWidth(),
										m_refImage.getAccess().getHeight(),
										m_refImage.getAccess().getDepth(),
										m_refImage.getAccess().getDataPtr());
}